

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O3

void density_tests::detail::
     PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>
     ::
     put_impl<density::sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>::reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>::Data>>
               (reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::Data>
                *i_transaction,EasyRandom *i_rand)

{
  iterator __position;
  undefined1 auVar1 [16];
  reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::Data>
  *this;
  result_type rVar2;
  long lVar3;
  vector<char*,std::allocator<char*>> *this_00;
  uint uVar4;
  size_t i_size;
  double dVar5;
  char *chars;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_double>
  __aurng;
  param_type local_58;
  reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::Data>
  *local_48;
  EasyRandom *local_40;
  long local_38;
  
  local_58._M_a = 0;
  local_58._M_b = 200;
  local_48 = i_transaction;
  local_40 = i_rand;
  rVar2 = std::uniform_int_distribution<unsigned_long>::operator()
                    ((uniform_int_distribution<unsigned_long> *)&local_58,&i_rand->m_rand,&local_58)
  ;
  this = local_48;
  if (rVar2 != 0) {
    lVar3 = -rVar2;
    uVar4 = (int)rVar2 + 0x30;
    i_size = rVar2 + 1;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = rVar2;
      local_38 = lVar3;
      local_58._M_a =
           (unsigned_long)
           density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
           ::
           reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::Data>
           ::raw_allocate(this,i_size,1);
      memset((void *)local_58._M_a,
             (uint)(byte)((char)uVar4 +
                         ((byte)(SUB164(auVar1 * ZEXT816(0xcccccccccccccccd),8) >> 2) & 0xfe) * -5),
             i_size - 1);
      *(char *)(local_58._M_a + (i_size - 1)) = '\0';
      this_00 = (vector<char*,std::allocator<char*>> *)
                density::
                sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                ::
                reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::Data>
                ::element_ptr(this);
      __position._M_current = *(char ***)(this_00 + 8);
      if (__position._M_current == *(char ***)(this_00 + 0x10)) {
        std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*const&>
                  (this_00,__position,(char **)&local_58);
      }
      else {
        *__position._M_current = (char *)local_58._M_a;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
      dVar5 = std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&local_40->m_rand);
      lVar3 = local_38;
      if (dVar5 < 0.05) {
        exception_checkpoint();
      }
      uVar4 = (uint)(byte)((char)uVar4 - 1);
      rVar2 = rVar2 - 1;
      lVar3 = lVar3 + 1;
      i_size = i_size - 1;
    } while (lVar3 != 0);
  }
  exception_checkpoint();
  return;
}

Assistant:

static void put_impl(PUT_TRANSACTION & i_transaction, EasyRandom & i_rand)
            {
                size_t count = i_rand.get_int<size_t>(0, 200);
                for (size_t index = 0; index < count; index++)
                {
                    auto const size      = count - index;
                    auto const fill_char = static_cast<char>('0' + size % 10);
                    auto const chars = static_cast<char *>(i_transaction.raw_allocate(size + 1, 1));
                    memset(chars, fill_char, size);
                    chars[size] = 0;
                    i_transaction.element().m_blocks.push_back(chars);

                    if (i_rand.get_bool(.05))
                    {
                        exception_checkpoint();
                    }
                }
                exception_checkpoint();
            }